

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O0

Object * load_library(Object *__return_storage_ptr__,int c,Environment *env,char *s)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  void *lib;
  char *s_local;
  Environment *env_local;
  int c_local;
  
  lib = s;
  if (env != (Environment *)0x0) {
    lib = get_string("x",c,env);
  }
  iVar1 = hasLib((char *)lib);
  if (iVar1 == 0) {
    pvVar2 = (void *)dlopen(lib,1);
    if (pvVar2 == (void *)0x0) {
      uVar3 = dlerror();
      printf("\x1b[31m\n[Runtime Error] [Line:%d] %s\x1b[0m",(ulong)(uint)c,uVar3);
      stop();
    }
    libCount = libCount + 1;
    libraries = (Library *)realloc(libraries,(long)libCount << 4);
    libraries[libCount + -1].name = (char *)lib;
    libraries[libCount + -1].handle = pvVar2;
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  else {
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object load_library(int c, Environment *env, char *s){
    if(env != NULL)
        s = get_string("x", c, env);

    if(hasLib(s))
        return nullObject;

    void *lib = dlopen(s, RTLD_LAZY);
    if(!lib){
        printf(runtime_error("%s"), c, dlerror());
        stop();
    }
    libCount++;
    libraries = (Library *)reallocate(libraries, sizeof(Library) * libCount);
    libraries[libCount - 1].name = s;
    libraries[libCount - 1].handle = lib;

    return nullObject;
}